

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool __thiscall
cmInstallCommand::HandleDirectoryMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool optional;
  bool never;
  MessageLevel message;
  ostream *poVar3;
  cmInstallDirectoryGenerator *this_01;
  cmGlobalGenerator *this_02;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  string dir;
  char *local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string literal_args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  ostringstream e;
  string component;
  string permissions_dir;
  string permissions_file;
  string local_50;
  
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  permissions_file._M_dataplus._M_p = (pointer)&permissions_file.field_2;
  permissions_file._M_string_length = 0;
  permissions_file.field_2._M_local_buf[0] = '\0';
  permissions_dir._M_dataplus._M_p = (pointer)&permissions_dir.field_2;
  permissions_dir._M_string_length = 0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  permissions_dir.field_2._M_local_buf[0] = '\0';
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&component,(string *)&this->DefaultComponentName);
  literal_args._M_dataplus._M_p = (pointer)&literal_args.field_2;
  literal_args._M_string_length = 0;
  literal_args.field_2._M_local_buf[0] = '\0';
  bVar4 = false;
  iVar5 = 1;
  optional = false;
  never = false;
  local_2a0 = (char *)0x0;
  uVar6 = 1;
  do {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar6) {
      if ((dirs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           dirs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) && (local_2a0 != (char *)0x0)) {
        std::__cxx11::string::string((string *)&e,"",(allocator *)&dir);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dirs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
        std::__cxx11::string::~string((string *)&e);
      }
      bVar4 = true;
      if (dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (local_2a0 == (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar3 = std::operator<<((ostream *)&e,
                                   (string *)
                                   (args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
          std::operator<<(poVar3," given no DESTINATION!");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&dir);
LAB_00321b88:
          std::__cxx11::string::~string((string *)&dir);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_00321b9f:
          bVar4 = false;
        }
        else {
          message = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,never);
          this_00 = (this->super_cmCommand).Makefile;
          this_01 = (cmInstallDirectoryGenerator *)operator_new(0x138);
          cmInstallDirectoryGenerator::cmInstallDirectoryGenerator
                    (this_01,&dirs,local_2a0,permissions_file._M_dataplus._M_p,
                     permissions_dir._M_dataplus._M_p,&configurations,component._M_dataplus._M_p,
                     message,literal_args._M_dataplus._M_p,optional);
          cmMakefile::AddInstallGenerator(this_00,(cmInstallGenerator *)this_01);
          this_02 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
          cmGlobalGenerator::AddInstallComponent(this_02,component._M_dataplus._M_p);
        }
      }
      std::__cxx11::string::~string((string *)&literal_args);
      std::__cxx11::string::~string((string *)&component);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&configurations);
      std::__cxx11::string::~string((string *)&permissions_dir);
      std::__cxx11::string::~string((string *)&permissions_file);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&dirs);
      return bVar4;
    }
    bVar2 = std::operator==(pbVar1 + uVar6,"DESTINATION");
    if (bVar2) {
      iVar5 = 2;
      if (!bVar4) goto LAB_003214ed;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3," does not allow \"");
      poVar3 = std::operator<<(poVar3,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar6));
      std::operator<<(poVar3,"\" after PATTERN or REGEX.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&dir);
      goto LAB_00321b88;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar6,"OPTIONAL");
    if (bVar2) {
      if (!bVar4) {
        optional = true;
        goto LAB_003214ea;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3," does not allow \"");
      poVar3 = std::operator<<(poVar3,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar6));
      std::operator<<(poVar3,"\" after PATTERN or REGEX.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&dir);
      goto LAB_00321b88;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar6,"MESSAGE_NEVER");
    if (bVar2) {
      if (!bVar4) {
        never = true;
        goto LAB_003214ea;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3," does not allow \"");
      poVar3 = std::operator<<(poVar3,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar6));
      std::operator<<(poVar3,"\" after PATTERN or REGEX.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&dir);
      goto LAB_00321b88;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar6,"PATTERN");
    if (bVar2) {
      iVar5 = 3;
LAB_00321527:
      bVar4 = true;
      goto LAB_003214ed;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar6,"REGEX");
    if (bVar2) {
      iVar5 = 4;
      goto LAB_00321527;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar6,"EXCLUDE");
    if (bVar2) {
      if ((iVar5 - 5U < 0xfffffffe) && (bVar4)) goto LAB_00321563;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3," does not allow \"");
      poVar3 = std::operator<<(poVar3,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar6));
      std::operator<<(poVar3,"\" before a PATTERN or REGEX is given.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&dir);
      goto LAB_00321b88;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar6,"PERMISSIONS");
    if (bVar2) {
      if (bVar4) {
        std::__cxx11::string::append((char *)&literal_args);
        iVar5 = 7;
        goto LAB_003214ed;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3," does not allow \"");
      poVar3 = std::operator<<(poVar3,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar6));
      std::operator<<(poVar3,"\" before a PATTERN or REGEX is given.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&dir);
      goto LAB_00321b88;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar6,"FILE_PERMISSIONS");
    if (bVar2) {
      iVar5 = 5;
      if (!bVar4) goto LAB_003214ed;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3," does not allow \"");
      poVar3 = std::operator<<(poVar3,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar6));
      std::operator<<(poVar3,"\" after PATTERN or REGEX.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&dir);
      goto LAB_00321b88;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar6,
                            "DIRECTORY_PERMISSIONS");
    if (bVar2) {
      iVar5 = 6;
      if (!bVar4) goto LAB_003214ed;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3," does not allow \"");
      poVar3 = std::operator<<(poVar3,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar6));
      std::operator<<(poVar3,"\" after PATTERN or REGEX.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&dir);
      goto LAB_00321b88;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar6,
                            "USE_SOURCE_PERMISSIONS");
    if (bVar2) {
      if (!bVar4) {
LAB_00321563:
        std::__cxx11::string::append((char *)&literal_args);
        goto LAB_003214ea;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3," does not allow \"");
      poVar3 = std::operator<<(poVar3,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar6));
      std::operator<<(poVar3,"\" after PATTERN or REGEX.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&dir);
      goto LAB_00321b88;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar6,"FILES_MATCHING");
    if (bVar2) {
      if (!bVar4) goto LAB_00321563;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3," does not allow \"");
      poVar3 = std::operator<<(poVar3,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar6));
      std::operator<<(poVar3,"\" after PATTERN or REGEX.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&dir);
      goto LAB_00321b88;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar6,"CONFIGURATIONS");
    if (bVar2) {
      iVar5 = 8;
      if (!bVar4) goto LAB_003214ed;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3," does not allow \"");
      poVar3 = std::operator<<(poVar3,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar6));
      std::operator<<(poVar3,"\" after PATTERN or REGEX.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&dir);
      goto LAB_00321b88;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar6,"COMPONENT");
    if (bVar2) {
      iVar5 = 9;
      if (!bVar4) goto LAB_003214ed;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3," does not allow \"");
      poVar3 = std::operator<<(poVar3,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar6));
      std::operator<<(poVar3,"\" after PATTERN or REGEX.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&dir);
      goto LAB_00321b88;
    }
    switch(iVar5) {
    case 1:
      std::__cxx11::string::string
                ((string *)&dir,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar6));
      bVar2 = cmsys::SystemTools::FileIsFullPath(dir._M_dataplus._M_p);
      if (!bVar2) {
        cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::assign((char *)&dir);
        std::__cxx11::string::append((char *)&dir);
        std::__cxx11::string::append((string *)&dir);
      }
      bVar2 = cmsys::SystemTools::FileExists(dir._M_dataplus._M_p);
      if ((bVar2) && (bVar2 = cmsys::SystemTools::FileIsDirectory(&dir), !bVar2)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar3 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar3 = std::operator<<(poVar3," given non-directory \"");
        poVar3 = std::operator<<(poVar3,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar6));
        std::operator<<(poVar3,"\" to install.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::__cxx11::string::~string((string *)&dir);
        goto LAB_00321b9f;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&dirs,&dir);
      std::__cxx11::string::~string((string *)&dir);
      iVar5 = 1;
      break;
    case 2:
      local_2a0 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar6]._M_dataplus._M_p;
      goto LAB_003214ea;
    case 3:
      std::__cxx11::string::append((char *)&literal_args);
      cmsys::Glob::PatternToRegex
                ((string *)&e,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar6,false,false);
      cmsys::SystemTools::ReplaceString((string *)&e,"\\","\\\\");
      std::__cxx11::string::append((string *)&literal_args);
      std::__cxx11::string::append((char *)&literal_args);
      goto LAB_0032183e;
    case 4:
      std::__cxx11::string::append((char *)&literal_args);
      std::__cxx11::string::string
                ((string *)&e,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar6));
      cmsys::SystemTools::ReplaceString((string *)&e,"\\","\\\\");
      std::__cxx11::string::append((string *)&literal_args);
      std::__cxx11::string::append((char *)&literal_args);
LAB_0032183e:
      std::__cxx11::string::~string((string *)&e);
      goto LAB_003214ea;
    case 5:
      bVar2 = cmInstallCommandArguments::CheckPermissions
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar6,&permissions_file);
      iVar5 = 5;
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar3 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar3 = std::operator<<(poVar3," given invalid file permission \"");
        poVar3 = std::operator<<(poVar3,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar6));
        std::operator<<(poVar3,"\".");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        goto LAB_00321b88;
      }
      break;
    case 6:
      bVar2 = cmInstallCommandArguments::CheckPermissions
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar6,&permissions_dir);
      iVar5 = 6;
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar3 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar3 = std::operator<<(poVar3," given invalid directory permission \"");
        poVar3 = std::operator<<(poVar3,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar6));
        std::operator<<(poVar3,"\".");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        goto LAB_00321b88;
      }
      break;
    case 7:
      bVar2 = cmInstallCommandArguments::CheckPermissions
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar6,&literal_args);
      iVar5 = 7;
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar3 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar3 = std::operator<<(poVar3," given invalid permission \"");
        poVar3 = std::operator<<(poVar3,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar6));
        std::operator<<(poVar3,"\".");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&dir);
        goto LAB_00321b88;
      }
      break;
    case 8:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&configurations,
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar6);
      iVar5 = 8;
      break;
    case 9:
      std::__cxx11::string::_M_assign((string *)&component);
LAB_003214ea:
      iVar5 = 0;
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar3 = std::operator<<(poVar3," given unknown argument \"");
      poVar3 = std::operator<<(poVar3,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar6));
      std::operator<<(poVar3,"\".");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&dir);
      goto LAB_00321b88;
    }
LAB_003214ed:
    uVar6 = (ulong)((int)uVar6 + 1);
  } while( true );
}

Assistant:

bool
cmInstallCommand::HandleDirectoryMode(std::vector<std::string> const& args)
{
  enum Doing { DoingNone, DoingDirs, DoingDestination, DoingPattern,
               DoingRegex, DoingPermsFile, DoingPermsDir, DoingPermsMatch,
               DoingConfigurations, DoingComponent };
  Doing doing = DoingDirs;
  bool in_match_mode = false;
  bool optional = false;
  bool message_never = false;
  std::vector<std::string> dirs;
  const char* destination = 0;
  std::string permissions_file;
  std::string permissions_dir;
  std::vector<std::string> configurations;
  std::string component = this->DefaultComponentName;
  std::string literal_args;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "DESTINATION")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the destination property.
      doing = DoingDestination;
      }
    else if(args[i] == "OPTIONAL")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Mark the rule as optional.
      optional = true;
      doing = DoingNone;
      }
    else if(args[i] == "MESSAGE_NEVER")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Mark the rule as quiet.
      message_never = true;
      doing = DoingNone;
      }
    else if(args[i] == "PATTERN")
      {
      // Switch to a new pattern match rule.
      doing = DoingPattern;
      in_match_mode = true;
      }
    else if(args[i] == "REGEX")
      {
      // Switch to a new regex match rule.
      doing = DoingRegex;
      in_match_mode = true;
      }
    else if(args[i] == "EXCLUDE")
      {
      // Add this property to the current match rule.
      if(!in_match_mode || doing == DoingPattern || doing == DoingRegex)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" before a PATTERN or REGEX is given.";
        this->SetError(e.str());
        return false;
        }
      literal_args += " EXCLUDE";
      doing = DoingNone;
      }
    else if(args[i] == "PERMISSIONS")
      {
      if(!in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" before a PATTERN or REGEX is given.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the current match permissions property.
      literal_args += " PERMISSIONS";
      doing = DoingPermsMatch;
      }
    else if(args[i] == "FILE_PERMISSIONS")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the file permissions property.
      doing = DoingPermsFile;
      }
    else if(args[i] == "DIRECTORY_PERMISSIONS")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the directory permissions property.
      doing = DoingPermsDir;
      }
    else if(args[i] == "USE_SOURCE_PERMISSIONS")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Add this option literally.
      literal_args += " USE_SOURCE_PERMISSIONS";
      doing = DoingNone;
      }
    else if(args[i] == "FILES_MATCHING")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Add this option literally.
      literal_args += " FILES_MATCHING";
      doing = DoingNone;
      }
    else if(args[i] == "CONFIGURATIONS")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the configurations property.
      doing = DoingConfigurations;
      }
    else if(args[i] == "COMPONENT")
      {
      if(in_match_mode)
        {
        std::ostringstream e;
        e << args[0] << " does not allow \""
          << args[i] << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
        }

      // Switch to setting the component property.
      doing = DoingComponent;
      }
    else if(doing == DoingDirs)
      {
      // Convert this directory to a full path.
      std::string dir = args[i];
      if(!cmSystemTools::FileIsFullPath(dir.c_str()))
        {
        dir = this->Makefile->GetCurrentSourceDirectory();
        dir += "/";
        dir += args[i];
        }

      // Make sure the name is a directory.
      if(cmSystemTools::FileExists(dir.c_str()) &&
         !cmSystemTools::FileIsDirectory(dir))
        {
        std::ostringstream e;
        e << args[0] << " given non-directory \""
          << args[i] << "\" to install.";
        this->SetError(e.str());
        return false;
        }

      // Store the directory for installation.
      dirs.push_back(dir);
      }
    else if(doing == DoingConfigurations)
      {
      configurations.push_back(args[i]);
      }
    else if(doing == DoingDestination)
      {
      destination = args[i].c_str();
      doing = DoingNone;
      }
    else if(doing == DoingPattern)
      {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      literal_args += " REGEX \"/";
      std::string regex = cmsys::Glob::PatternToRegex(args[i], false);
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "$\"";
      doing = DoingNone;
      }
    else if(doing == DoingRegex)
      {
      literal_args += " REGEX \"";
    // Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__) || defined(__CYGWIN__)
      std::string regex = cmSystemTools::LowerCase(args[i]);
#else
      std::string regex = args[i];
#endif
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "\"";
      doing = DoingNone;
      }
    else if(doing == DoingComponent)
      {
      component = args[i];
      doing = DoingNone;
      }
    else if(doing == DoingPermsFile)
     {
     // Check the requested permission.
     if(!cmInstallCommandArguments::CheckPermissions(args[i],permissions_file))
        {
        std::ostringstream e;
        e << args[0] << " given invalid file permission \""
          << args[i] << "\".";
        this->SetError(e.str());
        return false;
        }
      }
    else if(doing == DoingPermsDir)
      {
      // Check the requested permission.
      if(!cmInstallCommandArguments::CheckPermissions(args[i],permissions_dir))
        {
        std::ostringstream e;
        e << args[0] << " given invalid directory permission \""
          << args[i] << "\".";
        this->SetError(e.str());
        return false;
        }
      }
    else if(doing == DoingPermsMatch)
      {
      // Check the requested permission.
      if(!cmInstallCommandArguments::CheckPermissions(args[i], literal_args))
        {
        std::ostringstream e;
        e << args[0] << " given invalid permission \""
          << args[i] << "\".";
        this->SetError(e.str());
        return false;
        }
      }
    else
      {
      // Unknown argument.
      std::ostringstream e;
      e << args[0] << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  // Support installing an empty directory.
  if(dirs.empty() && destination)
    {
    dirs.push_back("");
    }

  // Check if there is something to do.
  if(dirs.empty())
    {
    return true;
    }
  if(!destination)
    {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
    }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile, message_never);

  // Create the directory install generator.
  this->Makefile->AddInstallGenerator(
    new cmInstallDirectoryGenerator(dirs, destination,
                                    permissions_file.c_str(),
                                    permissions_dir.c_str(),
                                    configurations,
                                    component.c_str(),
                                    message,
                                    literal_args.c_str(),
                                    optional));

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()
    ->AddInstallComponent(component.c_str());

  return true;
}